

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O3

void signalHandler(int signum)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  float fVar3;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tVar4;
  ArgPositional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pAVar5;
  bool bVar6;
  ostream *poVar7;
  long lVar8;
  ArgFlag *pAVar9;
  long *plVar10;
  ArgOption<float> *pAVar11;
  long lVar12;
  size_type *psVar13;
  pointer pbVar14;
  long lVar15;
  char *pcVar16;
  int iVar17;
  uint b;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_09;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_11;
  allocator_type aStack_5d9;
  string sStack_5d8;
  undefined1 auStack_5b8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_598;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_588;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_578;
  int iStack_55c;
  double dStack_558;
  double dStack_550;
  double dStack_548;
  double dStack_540;
  undefined1 auStack_538 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_528 [16];
  ArgFlag *pAStack_420;
  ArgFlag *pAStack_418;
  ArgFlag *pAStack_410;
  ArgFlag *pAStack_408;
  ArgFlag *pAStack_400;
  ArgFlag *pAStack_3f8;
  ArgOption<float> *pAStack_3f0;
  ArgOption<unsigned_int> *pAStack_3e8;
  ArgOption<float> *pAStack_3e0;
  ArgOption<float> *pAStack_3d8;
  ArgFlag *pAStack_3d0;
  ArgPositional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pAStack_3c8;
  ArgFlag *pAStack_3c0;
  string sStack_3b8;
  long *aplStack_398 [2];
  long alStack_388 [59];
  ArgumentParser AStack_1b0;
  undefined8 *puStack_48;
  
  poVar7 = std::operator<<((ostream *)&std::cout,"Interrupt signal (");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,signum);
  std::operator<<(poVar7,") received.\n");
  lVar8 = std::chrono::_V2::steady_clock::now();
  lVar8 = lVar8 - (long)start.__d.__r;
  poVar7 = std::operator<<((ostream *)&std::cout,"stopped after: ");
  lVar15 = *(long *)poVar7;
  lVar12 = *(long *)(lVar15 + -0x18);
  *(uint *)(poVar7 + lVar12 + 0x18) = *(uint *)(poVar7 + lVar12 + 0x18) & 0xfffffefb | 4;
  *(undefined8 *)(poVar7 + *(long *)(lVar15 + -0x18) + 8) = 2;
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,(double)lVar8 / 1000000000.0);
  std::operator<<(poVar7,"s\n");
  pcVar16 = "UNKNOWN\n";
  std::operator<<((ostream *)&std::cout,"UNKNOWN\n");
  iVar17 = 1;
  _Exit(1);
  puStack_48 = &std::cout;
  signal(2,signalHandler);
  signal(0xf,signalHandler);
  paVar1 = &sStack_3b8.field_2;
  sStack_3b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&sStack_3b8,"SAT solver for propositional logic","");
  Utils::ArgumentParser::ArgumentParser(&AStack_1b0,&sStack_3b8,&program_description_abi_cxx11_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_3b8._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_3b8._M_dataplus._M_p,sStack_3b8.field_2._M_allocated_capacity + 1);
  }
  sStack_3b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_3b8,"input","");
  pcVar2 = auStack_538 + 0x10;
  auStack_538._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)auStack_538,"input file (in DIMACS format). If not specified, use stdin","");
  pAStack_3c8 = Utils::ArgumentParser::make_positional<std::__cxx11::string>
                          (&AStack_1b0,&sStack_3b8,(string *)auStack_538);
  if ((pointer)auStack_538._0_8_ != pcVar2) {
    operator_delete((void *)auStack_538._0_8_,aaStack_528[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_3b8._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_3b8._M_dataplus._M_p,sStack_3b8.field_2._M_allocated_capacity + 1);
  }
  auStack_538._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_538,"help","");
  sStack_5d8._M_dataplus._M_p = (pointer)&sStack_5d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&sStack_5d8,"print this message and exit","");
  sStack_3b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_3b8,"h","");
  plVar10 = alStack_388;
  aplStack_398[0] = plVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)aplStack_398,"help","");
  __l._M_len = 2;
  __l._M_array = &sStack_3b8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)auStack_5b8,__l,(allocator_type *)aStack_598._M_local_buf);
  pAStack_3c0 = Utils::ArgumentParser::make_flag
                          (&AStack_1b0,(string *)auStack_538,&sStack_5d8,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)auStack_5b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_5b8);
  lVar15 = -0x40;
  do {
    if (plVar10 != (long *)plVar10[-2]) {
      operator_delete((long *)plVar10[-2],*plVar10 + 1);
    }
    plVar10 = plVar10 + -4;
    lVar15 = lVar15 + 0x20;
  } while (lVar15 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_5d8._M_dataplus._M_p != &sStack_5d8.field_2) {
    operator_delete(sStack_5d8._M_dataplus._M_p,sStack_5d8.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)auStack_538._0_8_ != pcVar2) {
    operator_delete((void *)auStack_538._0_8_,aaStack_528[0]._M_allocated_capacity + 1);
  }
  auStack_538._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_538,"verbose","");
  sStack_5d8._M_dataplus._M_p = (pointer)&sStack_5d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&sStack_5d8,
             "print the resolution process step by step.\nWARNING: can be really expansive","");
  sStack_3b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_3b8,"v","");
  plVar10 = alStack_388;
  aplStack_398[0] = plVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)aplStack_398,"verbose","");
  __l_00._M_len = 2;
  __l_00._M_array = &sStack_3b8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)auStack_5b8,__l_00,(allocator_type *)aStack_598._M_local_buf);
  pAStack_3d0 = Utils::ArgumentParser::make_flag
                          (&AStack_1b0,(string *)auStack_538,&sStack_5d8,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)auStack_5b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_5b8);
  lVar15 = -0x40;
  do {
    if (plVar10 != (long *)plVar10[-2]) {
      operator_delete((long *)plVar10[-2],*plVar10 + 1);
    }
    plVar10 = plVar10 + -4;
    lVar15 = lVar15 + 0x20;
  } while (lVar15 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_5d8._M_dataplus._M_p != &sStack_5d8.field_2) {
    operator_delete(sStack_5d8._M_dataplus._M_p,sStack_5d8.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)auStack_538._0_8_ != pcVar2) {
    operator_delete((void *)auStack_538._0_8_,aaStack_528[0]._M_allocated_capacity + 1);
  }
  auStack_538._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_538,"print_proof","");
  sStack_5d8._M_dataplus._M_p = (pointer)&sStack_5d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&sStack_5d8,"print proof (both for sat and unsat)","");
  sStack_3b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_3b8,"p","");
  plVar10 = alStack_388;
  aplStack_398[0] = plVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)aplStack_398,"proof","");
  __l_01._M_len = 2;
  __l_01._M_array = &sStack_3b8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)auStack_5b8,__l_01,(allocator_type *)aStack_598._M_local_buf);
  pAStack_3f8 = Utils::ArgumentParser::make_flag
                          (&AStack_1b0,(string *)auStack_538,&sStack_5d8,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)auStack_5b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_5b8);
  lVar15 = -0x40;
  do {
    if (plVar10 != (long *)plVar10[-2]) {
      operator_delete((long *)plVar10[-2],*plVar10 + 1);
    }
    plVar10 = plVar10 + -4;
    lVar15 = lVar15 + 0x20;
  } while (lVar15 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_5d8._M_dataplus._M_p != &sStack_5d8.field_2) {
    operator_delete(sStack_5d8._M_dataplus._M_p,sStack_5d8.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)auStack_538._0_8_ != pcVar2) {
    operator_delete((void *)auStack_538._0_8_,aaStack_528[0]._M_allocated_capacity + 1);
  }
  sStack_3b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_3b8,"no_preprocessing","");
  auStack_538._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)auStack_538,"disable preprocessing of clause","");
  sStack_5d8._M_dataplus._M_p = (pointer)&sStack_5d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_5d8,"no-preprocessing","");
  __l_02._M_len = 1;
  __l_02._M_array = &sStack_5d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)auStack_5b8,__l_02,(allocator_type *)aStack_598._M_local_buf);
  pAVar9 = Utils::ArgumentParser::make_flag
                     (&AStack_1b0,&sStack_3b8,(string *)auStack_538,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)auStack_5b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_5b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_5d8._M_dataplus._M_p != &sStack_5d8.field_2) {
    operator_delete(sStack_5d8._M_dataplus._M_p,sStack_5d8.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)auStack_538._0_8_ != pcVar2) {
    operator_delete((void *)auStack_538._0_8_,aaStack_528[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_3b8._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_3b8._M_dataplus._M_p,sStack_3b8.field_2._M_allocated_capacity + 1);
  }
  sStack_3b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_3b8,"no_restart","");
  auStack_538._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_538,"disable search restart","")
  ;
  sStack_5d8._M_dataplus._M_p = (pointer)&sStack_5d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_5d8,"no-restart","");
  __l_03._M_len = 1;
  __l_03._M_array = &sStack_5d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)auStack_5b8,__l_03,(allocator_type *)aStack_598._M_local_buf);
  pAStack_400 = Utils::ArgumentParser::make_flag
                          (&AStack_1b0,&sStack_3b8,(string *)auStack_538,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)auStack_5b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_5b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_5d8._M_dataplus._M_p != &sStack_5d8.field_2) {
    operator_delete(sStack_5d8._M_dataplus._M_p,sStack_5d8.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)auStack_538._0_8_ != pcVar2) {
    operator_delete((void *)auStack_538._0_8_,aaStack_528[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_3b8._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_3b8._M_dataplus._M_p,sStack_3b8.field_2._M_allocated_capacity + 1);
  }
  sStack_3b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_3b8,"no_deletion","");
  auStack_538._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)auStack_538,"disable deletion of learned clauses","");
  sStack_5d8._M_dataplus._M_p = (pointer)&sStack_5d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_5d8,"no-deletion","");
  __l_04._M_len = 1;
  __l_04._M_array = &sStack_5d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)auStack_5b8,__l_04,(allocator_type *)aStack_598._M_local_buf);
  pAStack_408 = Utils::ArgumentParser::make_flag
                          (&AStack_1b0,&sStack_3b8,(string *)auStack_538,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)auStack_5b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_5b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_5d8._M_dataplus._M_p != &sStack_5d8.field_2) {
    operator_delete(sStack_5d8._M_dataplus._M_p,sStack_5d8.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)auStack_538._0_8_ != pcVar2) {
    operator_delete((void *)auStack_538._0_8_,aaStack_528[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_3b8._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_3b8._M_dataplus._M_p,sStack_3b8.field_2._M_allocated_capacity + 1);
  }
  sStack_3b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_3b8,"no_random_choice","");
  auStack_538._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)auStack_538,"disable random selection of literal in 1% of the cases","");
  sStack_5d8._M_dataplus._M_p = (pointer)&sStack_5d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_5d8,"no-random","");
  __l_05._M_len = 1;
  __l_05._M_array = &sStack_5d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)auStack_5b8,__l_05,(allocator_type *)aStack_598._M_local_buf);
  pAStack_410 = Utils::ArgumentParser::make_flag
                          (&AStack_1b0,&sStack_3b8,(string *)auStack_538,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)auStack_5b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_5b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_5d8._M_dataplus._M_p != &sStack_5d8.field_2) {
    operator_delete(sStack_5d8._M_dataplus._M_p,sStack_5d8.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)auStack_538._0_8_ != pcVar2) {
    operator_delete((void *)auStack_538._0_8_,aaStack_528[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_3b8._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_3b8._M_dataplus._M_p,sStack_3b8.field_2._M_allocated_capacity + 1);
  }
  sStack_3b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_3b8,"no_cc_reduction","");
  auStack_538._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)auStack_538,"disable reduction of the conflict clause","");
  sStack_5d8._M_dataplus._M_p = (pointer)&sStack_5d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_5d8,"no-cc-reduction","");
  __l_06._M_len = 1;
  __l_06._M_array = &sStack_5d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)auStack_5b8,__l_06,(allocator_type *)aStack_598._M_local_buf);
  pAStack_418 = Utils::ArgumentParser::make_flag
                          (&AStack_1b0,&sStack_3b8,(string *)auStack_538,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)auStack_5b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_5b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_5d8._M_dataplus._M_p != &sStack_5d8.field_2) {
    operator_delete(sStack_5d8._M_dataplus._M_p,sStack_5d8.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)auStack_538._0_8_ != pcVar2) {
    operator_delete((void *)auStack_538._0_8_,aaStack_528[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_3b8._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_3b8._M_dataplus._M_p,sStack_3b8.field_2._M_allocated_capacity + 1);
  }
  sStack_3b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_3b8,"clause decay","");
  dStack_540 = 0.9990000128746033;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_5b8,
             vsnprintf,0x3a,"%f");
  plVar10 = (long *)std::__cxx11::string::replace((ulong)auStack_5b8,0,(char *)0x0,0x117854);
  sStack_5d8._M_dataplus._M_p = (pointer)&sStack_5d8.field_2;
  psVar13 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    sStack_5d8.field_2._M_allocated_capacity = *psVar13;
    sStack_5d8.field_2._8_8_ = plVar10[3];
  }
  else {
    sStack_5d8.field_2._M_allocated_capacity = *psVar13;
    sStack_5d8._M_dataplus._M_p = (pointer)*plVar10;
  }
  sStack_5d8._M_string_length = plVar10[1];
  *plVar10 = (long)psVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&sStack_5d8);
  psVar13 = (size_type *)(plVar10 + 2);
  if ((size_type *)*plVar10 == psVar13) {
    aaStack_528[0]._0_8_ = *psVar13;
    aaStack_528[0]._8_4_ = (undefined4)plVar10[3];
    aaStack_528[0]._12_4_ = *(undefined4 *)((long)plVar10 + 0x1c);
    auStack_538._0_8_ = pcVar2;
  }
  else {
    aaStack_528[0]._0_8_ = *psVar13;
    auStack_538._0_8_ = (size_type *)*plVar10;
  }
  auStack_538._8_8_ = plVar10[1];
  *plVar10 = (long)psVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  aStack_598._M_allocated_capacity = (size_type)&aStack_588;
  std::__cxx11::string::_M_construct<char_const*>((string *)&aStack_598,"c-decay","");
  __l_07._M_len = 1;
  __l_07._M_array = (iterator)&aStack_598;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&vStack_578,__l_07,&aStack_5d9);
  pAStack_3d8 = Utils::ArgumentParser::make_option<float>
                          (&AStack_1b0,&sStack_3b8,(string *)auStack_538,&vStack_578);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_578);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)aStack_598._M_allocated_capacity != &aStack_588) {
    operator_delete((void *)aStack_598._M_allocated_capacity,aStack_588._M_allocated_capacity + 1);
  }
  if ((pointer)auStack_538._0_8_ != pcVar2) {
    operator_delete((void *)auStack_538._0_8_,aaStack_528[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_5d8._M_dataplus._M_p != &sStack_5d8.field_2) {
    operator_delete(sStack_5d8._M_dataplus._M_p,sStack_5d8.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)auStack_5b8._0_8_ != (pointer)(auStack_5b8 + 0x10)) {
    operator_delete((void *)auStack_5b8._0_8_,(ulong)(auStack_5b8._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_3b8._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_3b8._M_dataplus._M_p,sStack_3b8.field_2._M_allocated_capacity + 1);
  }
  sStack_3b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_3b8,"literal decay","");
  dStack_548 = 0.949999988079071;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_5b8,
             vsnprintf,0x3a,"%f");
  plVar10 = (long *)std::__cxx11::string::replace((ulong)auStack_5b8,0,(char *)0x0,0x1178b7);
  sStack_5d8._M_dataplus._M_p = (pointer)&sStack_5d8.field_2;
  psVar13 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    sStack_5d8.field_2._M_allocated_capacity = *psVar13;
    sStack_5d8.field_2._8_8_ = plVar10[3];
  }
  else {
    sStack_5d8.field_2._M_allocated_capacity = *psVar13;
    sStack_5d8._M_dataplus._M_p = (pointer)*plVar10;
  }
  sStack_5d8._M_string_length = plVar10[1];
  *plVar10 = (long)psVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&sStack_5d8);
  psVar13 = (size_type *)(plVar10 + 2);
  if ((size_type *)*plVar10 == psVar13) {
    aaStack_528[0]._0_8_ = *psVar13;
    aaStack_528[0]._8_4_ = (undefined4)plVar10[3];
    aaStack_528[0]._12_4_ = *(undefined4 *)((long)plVar10 + 0x1c);
    auStack_538._0_8_ = pcVar2;
  }
  else {
    aaStack_528[0]._0_8_ = *psVar13;
    auStack_538._0_8_ = (size_type *)*plVar10;
  }
  auStack_538._8_8_ = plVar10[1];
  *plVar10 = (long)psVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  aStack_598._M_allocated_capacity = (size_type)&aStack_588;
  std::__cxx11::string::_M_construct<char_const*>((string *)&aStack_598,"l-decay","");
  __l_08._M_len = 1;
  __l_08._M_array = (iterator)&aStack_598;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&vStack_578,__l_08,&aStack_5d9);
  pAStack_3e0 = Utils::ArgumentParser::make_option<float>
                          (&AStack_1b0,&sStack_3b8,(string *)auStack_538,&vStack_578);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_578);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)aStack_598._M_allocated_capacity != &aStack_588) {
    operator_delete((void *)aStack_598._M_allocated_capacity,aStack_588._M_allocated_capacity + 1);
  }
  if ((pointer)auStack_538._0_8_ != pcVar2) {
    operator_delete((void *)auStack_538._0_8_,aaStack_528[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_5d8._M_dataplus._M_p != &sStack_5d8.field_2) {
    operator_delete(sStack_5d8._M_dataplus._M_p,sStack_5d8.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)auStack_5b8._0_8_ != (pointer)(auStack_5b8 + 0x10)) {
    operator_delete((void *)auStack_5b8._0_8_,(ulong)(auStack_5b8._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_3b8._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_3b8._M_dataplus._M_p,sStack_3b8.field_2._M_allocated_capacity + 1);
  }
  auStack_538._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_538,"restart multiplier","");
  aStack_598._M_allocated_capacity = (size_type)&aStack_588;
  pAStack_420 = pAVar9;
  std::__cxx11::string::_M_construct((ulong)&aStack_598,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)aStack_598._M_allocated_capacity,aStack_598._8_4_,100);
  plVar10 = (long *)std::__cxx11::string::replace((ulong)&aStack_598,0,(char *)0x0,0x117920);
  auStack_5b8._0_8_ = auStack_5b8 + 0x10;
  pbVar14 = (pointer)(plVar10 + 2);
  if ((pointer)*plVar10 == pbVar14) {
    auStack_5b8._16_8_ = (pbVar14->_M_dataplus)._M_p;
    auStack_5b8._24_8_ = plVar10[3];
  }
  else {
    auStack_5b8._16_8_ = (pbVar14->_M_dataplus)._M_p;
    auStack_5b8._0_8_ = (pointer)*plVar10;
  }
  auStack_5b8._8_8_ = plVar10[1];
  *plVar10 = (long)pbVar14;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append(auStack_5b8);
  sStack_5d8._M_dataplus._M_p = (pointer)&sStack_5d8.field_2;
  psVar13 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    sStack_5d8.field_2._M_allocated_capacity = *psVar13;
    sStack_5d8.field_2._8_8_ = plVar10[3];
  }
  else {
    sStack_5d8.field_2._M_allocated_capacity = *psVar13;
    sStack_5d8._M_dataplus._M_p = (pointer)*plVar10;
  }
  sStack_5d8._M_string_length = plVar10[1];
  *plVar10 = (long)psVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  iStack_55c = iVar17;
  sStack_3b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_3b8,"b","");
  plVar10 = alStack_388;
  aplStack_398[0] = plVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)aplStack_398,"restart-mult","");
  __l_09._M_len = 2;
  __l_09._M_array = &sStack_3b8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&vStack_578,__l_09,&aStack_5d9);
  pAStack_3e8 = Utils::ArgumentParser::make_option<unsigned_int>
                          (&AStack_1b0,(string *)auStack_538,&sStack_5d8,&vStack_578);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_578);
  lVar15 = -0x40;
  do {
    if (plVar10 != (long *)plVar10[-2]) {
      operator_delete((long *)plVar10[-2],*plVar10 + 1);
    }
    plVar10 = plVar10 + -4;
    lVar15 = lVar15 + 0x20;
  } while (lVar15 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_5d8._M_dataplus._M_p != &sStack_5d8.field_2) {
    operator_delete(sStack_5d8._M_dataplus._M_p,sStack_5d8.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)auStack_5b8._0_8_ != (pointer)(auStack_5b8 + 0x10)) {
    operator_delete((void *)auStack_5b8._0_8_,(ulong)(auStack_5b8._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)aStack_598._M_allocated_capacity != &aStack_588) {
    operator_delete((void *)aStack_598._M_allocated_capacity,aStack_588._M_allocated_capacity + 1);
  }
  if ((pointer)auStack_538._0_8_ != pcVar2) {
    operator_delete((void *)auStack_538._0_8_,aaStack_528[0]._M_allocated_capacity + 1);
  }
  auStack_538._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_538,"learn multiplier","");
  dStack_550 = 0.5;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&aStack_598,
             vsnprintf,0x3a,"%f");
  plVar10 = (long *)std::__cxx11::string::replace((ulong)&aStack_598,0,(char *)0x0,0x11796c);
  auStack_5b8._0_8_ = auStack_5b8 + 0x10;
  pbVar14 = (pointer)(plVar10 + 2);
  if ((pointer)*plVar10 == pbVar14) {
    auStack_5b8._16_8_ = (pbVar14->_M_dataplus)._M_p;
    auStack_5b8._24_8_ = plVar10[3];
  }
  else {
    auStack_5b8._16_8_ = (pbVar14->_M_dataplus)._M_p;
    auStack_5b8._0_8_ = (pointer)*plVar10;
  }
  auStack_5b8._8_8_ = plVar10[1];
  *plVar10 = (long)pbVar14;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append(auStack_5b8);
  sStack_5d8._M_dataplus._M_p = (pointer)&sStack_5d8.field_2;
  psVar13 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    sStack_5d8.field_2._M_allocated_capacity = *psVar13;
    sStack_5d8.field_2._8_8_ = plVar10[3];
  }
  else {
    sStack_5d8.field_2._M_allocated_capacity = *psVar13;
    sStack_5d8._M_dataplus._M_p = (pointer)*plVar10;
  }
  sStack_5d8._M_string_length = plVar10[1];
  *plVar10 = (long)psVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  sStack_3b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_3b8,"l","");
  plVar10 = alStack_388;
  aplStack_398[0] = plVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)aplStack_398,"learn-mult","");
  __l_10._M_len = 2;
  __l_10._M_array = &sStack_3b8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&vStack_578,__l_10,&aStack_5d9);
  pAVar11 = Utils::ArgumentParser::make_option<float>
                      (&AStack_1b0,(string *)auStack_538,&sStack_5d8,&vStack_578);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_578);
  lVar15 = -0x40;
  do {
    if (plVar10 != (long *)plVar10[-2]) {
      operator_delete((long *)plVar10[-2],*plVar10 + 1);
    }
    plVar10 = plVar10 + -4;
    lVar15 = lVar15 + 0x20;
  } while (lVar15 != 0);
  pAStack_3f0 = pAVar11;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_5d8._M_dataplus._M_p != &sStack_5d8.field_2) {
    operator_delete(sStack_5d8._M_dataplus._M_p,sStack_5d8.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)auStack_5b8._0_8_ != (pointer)(auStack_5b8 + 0x10)) {
    operator_delete((void *)auStack_5b8._0_8_,(ulong)(auStack_5b8._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)aStack_598._M_allocated_capacity != &aStack_588) {
    operator_delete((void *)aStack_598._M_allocated_capacity,aStack_588._M_allocated_capacity + 1);
  }
  if ((pointer)auStack_538._0_8_ != pcVar2) {
    operator_delete((void *)auStack_538._0_8_,aaStack_528[0]._M_allocated_capacity + 1);
  }
  auStack_538._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_538,"learn increase","");
  dStack_558 = 10.0;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&aStack_598,
             vsnprintf,0x3a,"%f");
  plVar10 = (long *)std::__cxx11::string::replace((ulong)&aStack_598,0,(char *)0x0,0x1179d7);
  pbVar14 = (pointer)(plVar10 + 2);
  if ((pointer)*plVar10 == pbVar14) {
    auStack_5b8._16_8_ = (pbVar14->_M_dataplus)._M_p;
    auStack_5b8._24_8_ = plVar10[3];
    auStack_5b8._0_8_ = (pointer)(auStack_5b8 + 0x10);
  }
  else {
    auStack_5b8._16_8_ = (pbVar14->_M_dataplus)._M_p;
    auStack_5b8._0_8_ = (pointer)*plVar10;
  }
  auStack_5b8._8_8_ = plVar10[1];
  *plVar10 = (long)pbVar14;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append(auStack_5b8);
  sStack_5d8._M_dataplus._M_p = (pointer)&sStack_5d8.field_2;
  psVar13 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    sStack_5d8.field_2._M_allocated_capacity = *psVar13;
    sStack_5d8.field_2._8_8_ = plVar10[3];
  }
  else {
    sStack_5d8.field_2._M_allocated_capacity = *psVar13;
    sStack_5d8._M_dataplus._M_p = (pointer)*plVar10;
  }
  sStack_5d8._M_string_length = plVar10[1];
  *plVar10 = (long)psVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  sStack_3b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_3b8,"i","");
  plVar10 = alStack_388;
  aplStack_398[0] = plVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)aplStack_398,"learn-increase","");
  __l_11._M_len = 2;
  __l_11._M_array = &sStack_3b8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&vStack_578,__l_11,&aStack_5d9);
  pAVar11 = Utils::ArgumentParser::make_option<float>
                      (&AStack_1b0,(string *)auStack_538,&sStack_5d8,&vStack_578);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_578);
  lVar15 = -0x40;
  do {
    if (plVar10 != (long *)plVar10[-2]) {
      operator_delete((long *)plVar10[-2],*plVar10 + 1);
    }
    plVar10 = plVar10 + -4;
    lVar15 = lVar15 + 0x20;
  } while (lVar15 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_5d8._M_dataplus._M_p != &sStack_5d8.field_2) {
    operator_delete(sStack_5d8._M_dataplus._M_p,sStack_5d8.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)auStack_5b8._0_8_ != (pointer)(auStack_5b8 + 0x10)) {
    operator_delete((void *)auStack_5b8._0_8_,(ulong)(auStack_5b8._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)aStack_598._M_allocated_capacity != &aStack_588) {
    operator_delete((void *)aStack_598._M_allocated_capacity,aStack_588._M_allocated_capacity + 1);
  }
  if ((pointer)auStack_538._0_8_ != pcVar2) {
    operator_delete((void *)auStack_538._0_8_,aaStack_528[0]._M_allocated_capacity + 1);
  }
  Utils::ArgumentParser::parseCLI(&AStack_1b0,iStack_55c,(char **)pcVar16);
  if ((pAStack_3c0->super_ArgObject).parsed == true) {
    Utils::ArgumentParser::get_message_abi_cxx11_(&sStack_3b8,&AStack_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,sStack_3b8._M_dataplus._M_p,sStack_3b8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_3b8._M_dataplus._M_p != paVar1) {
      operator_delete(sStack_3b8._M_dataplus._M_p,sStack_3b8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::ifstream::ifstream(&sStack_3b8);
    std::istream::istream(auStack_538,(streambuf *)0x0);
    pAVar5 = pAStack_3c8;
    if ((pAStack_3c8->
        super_TypedArgObj<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ).super_ValueArgObj.super_ArgObject.parsed == true) {
      std::ifstream::open((string *)&sStack_3b8,(int)pAStack_3c8 + 0x50);
      if (*(int *)((long)aplStack_398 + *(long *)(sStack_3b8._M_dataplus._M_p + -0x18)) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ERROR: file ",0xc)
        ;
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,
                            (pAVar5->
                            super_TypedArgObj<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ).value._M_dataplus._M_p,
                            (pAVar5->
                            super_TypedArgObj<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ).value._M_string_length);
        std::operator<<(poVar7," doesn\'t exist\n");
        exit(0);
      }
      std::ios::rdbuf((streambuf *)(auStack_538 + *(long *)(auStack_538._0_8_ + -0x18)));
    }
    else {
      std::ios::rdbuf((streambuf *)(auStack_538 + *(long *)(auStack_538._0_8_ + -0x18)));
    }
    if ((pAStack_3d8->super_TypedArgObj<float>).field_0x48 == '\x01') {
      fVar3 = (pAStack_3d8->super_TypedArgObj<float>).value;
      if ((fVar3 <= 0.0) || (1.0 < fVar3)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,anon_var_dwarf_c854,0x25);
        Utils::operator<<((ostream *)&std::cout,&AStack_1b0);
        goto LAB_0010c481;
      }
      dStack_540 = (double)fVar3;
    }
    if ((pAStack_3e0->super_TypedArgObj<float>).field_0x48 == '\x01') {
      fVar3 = (pAStack_3e0->super_TypedArgObj<float>).value;
      if ((fVar3 <= 0.0) || (1.0 < fVar3)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,anon_var_dwarf_c86d,0x25);
        Utils::operator<<((ostream *)&std::cout,&AStack_1b0);
        goto LAB_0010c481;
      }
      dStack_548 = (double)fVar3;
    }
    b = 100;
    if (((pAStack_3e8->super_TypedArgObj<unsigned_int>).field_0x48 == '\x01') &&
       (b = (pAStack_3e8->super_TypedArgObj<unsigned_int>).value, b == 0)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,anon_var_dwarf_c878,0x26);
      Utils::operator<<((ostream *)&std::cout,&AStack_1b0);
LAB_0010c481:
      exit(1);
    }
    if ((pAStack_3f0->super_TypedArgObj<float>).field_0x48 == '\x01') {
      fVar3 = (pAStack_3f0->super_TypedArgObj<float>).value;
      if (fVar3 <= 0.0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"ERROR: should be learn-mult > 0.0\n",0x22);
        Utils::operator<<((ostream *)&std::cout,&AStack_1b0);
        goto LAB_0010c481;
      }
      dStack_550 = (double)fVar3;
    }
    if ((pAVar11->super_TypedArgObj<float>).field_0x48 == '\x01') {
      fVar3 = (pAVar11->super_TypedArgObj<float>).value;
      if (fVar3 < 0.0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,anon_var_dwarf_c89c,0x24);
        Utils::operator<<((ostream *)&std::cout,&AStack_1b0);
        goto LAB_0010c481;
      }
      dStack_558 = (double)fVar3;
    }
    Satyricon::SATSolver::set_log(&solver,(pAStack_3d0->super_ArgObject).parsed + 1);
    start.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    bVar6 = Satyricon::parse_file(&solver,(istream *)auStack_538);
    lVar12 = std::chrono::_V2::steady_clock::now();
    tVar4 = start;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"read file and initialized solver in: ",0x25);
    lVar15 = std::cout;
    *(uint *)(malloc + *(long *)(std::cout + -0x18)) =
         *(uint *)(malloc + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar15 + -0x18)) = 2;
    poVar7 = std::ostream::_M_insert<double>
                       ((double)((float)(lVar12 - (long)tVar4.__d.__r) / 1e+09));
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"s\n",2);
    if (bVar6) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"found a conflict during solver construction\n",0x2c);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"UNSATISFIABLE",0xd);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
    }
    else {
      if ((pAStack_420->super_ArgObject).parsed == true) {
        Satyricon::SATSolver::set_preprocessing(&solver,false);
      }
      if ((pAStack_400->super_ArgObject).parsed == true) {
        Satyricon::SATSolver::set_restart(&solver,false);
      }
      if ((pAStack_408->super_ArgObject).parsed == true) {
        Satyricon::SATSolver::set_deletion(&solver,false);
      }
      if ((pAStack_410->super_ArgObject).parsed == true) {
        Satyricon::SATSolver::set_random_choice(&solver,false);
      }
      if ((pAStack_418->super_ArgObject).parsed == true) {
        Satyricon::SATSolver::set_conflict_clause_reduction(&solver,false);
      }
      Satyricon::SATSolver::set_clause_decay(&solver,dStack_540);
      Satyricon::SATSolver::set_literal_decay(&solver,dStack_548);
      Satyricon::SATSolver::set_learning_multiplier(&solver,dStack_550);
      Satyricon::SATSolver::set_learning_increase(&solver,dStack_558);
      Satyricon::SATSolver::set_restarting_multiplier(&solver,b);
      bVar6 = Satyricon::SATSolver::solve(&solver);
      lVar12 = std::chrono::_V2::steady_clock::now();
      tVar4 = start;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"completed in: ",0xe)
      ;
      lVar15 = std::cout;
      *(uint *)(malloc + *(long *)(std::cout + -0x18)) =
           *(uint *)(malloc + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar15 + -0x18)) = 2;
      poVar7 = std::ostream::_M_insert<double>
                         ((double)(lVar12 - (long)tVar4.__d.__r) / 1000000000.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"s\n",2);
      pcVar16 = "UNSATISFIABLE";
      if (bVar6) {
        pcVar16 = "SATISFIABLE";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,pcVar16,(ulong)!bVar6 * 2 + 0xb);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      if ((bVar6 & (pAStack_3f8->super_ArgObject).parsed) == 1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Model: ",7);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
        std::ostream::put(-0x28);
        poVar7 = (ostream *)std::ostream::flush();
        Satyricon::SATSolver::string_model_abi_cxx11_(&sStack_5d8,&solver);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,sStack_5d8._M_dataplus._M_p,sStack_5d8._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sStack_5d8._M_dataplus._M_p != &sStack_5d8.field_2) {
          operator_delete(sStack_5d8._M_dataplus._M_p,sStack_5d8.field_2._M_allocated_capacity + 1);
        }
      }
    }
    auStack_538._0_8_ = _VTT;
    *(undefined8 *)(auStack_538 + *(long *)(_VTT + -0x18)) = __ITM_deregisterTMCloneTable;
    auStack_538._8_8_ = 0;
    std::ios_base::~ios_base((ios_base *)(auStack_538 + 0x10));
    std::ifstream::~ifstream(&sStack_3b8);
  }
  Utils::ArgumentParser::~ArgumentParser(&AStack_1b0);
  return;
}

Assistant:

void signalHandler( int signum ) {
    //TODO: print solver status
    cout << "Interrupt signal (" << signum << ") received.\n";

    auto end_time = std::chrono::steady_clock::now();
    std::chrono::duration<double> elapsed = end_time - start;
    cout << "stopped after: " << std::fixed << std::setprecision(2) <<
        elapsed.count() << "s\n";

    cout << "UNKNOWN\n";
    std::_Exit(1); // quick exit
}